

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXRefYs<unsigned_int>,_ImPlot::GetterXRefYs<unsigned_int>,_ImPlot::TransformerLinLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterXRefYs<unsigned_int>,_ImPlot::GetterXRefYs<unsigned_int>,_ImPlot::TransformerLinLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterXRefYs<unsigned_int> *pGVar8;
  TransformerLinLog *pTVar9;
  ImPlotPlot *pIVar10;
  ImDrawVert *pIVar11;
  ImDrawIdx *pIVar12;
  ImPlotContext *pIVar13;
  ImPlotContext *pIVar14;
  ImDrawIdx IVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  double dVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  pIVar13 = GImPlot;
  pGVar8 = this->Getter1;
  pTVar9 = this->Transformer;
  dVar2 = pGVar8->XRef;
  iVar5 = pGVar8->Count;
  dVar20 = log10((double)*(uint *)((long)pGVar8->Ys +
                                  (long)(((pGVar8->Offset + prim) % iVar5 + iVar5) % iVar5) *
                                  (long)pGVar8->Stride) /
                 GImPlot->CurrentPlot->YAxis[pTVar9->YAxis].Range.Min);
  pIVar14 = GImPlot;
  iVar5 = pTVar9->YAxis;
  pIVar10 = pIVar13->CurrentPlot;
  dVar3 = pIVar10->YAxis[iVar5].Range.Min;
  fVar21 = (float)((dVar2 - (pIVar10->XAxis).Range.Min) * pIVar13->Mx +
                  (double)pIVar13->PixelRange[iVar5].Min.x);
  fVar17 = (float)((((double)(float)(dVar20 / pIVar13->LogDenY[iVar5]) *
                     (pIVar10->YAxis[iVar5].Range.Max - dVar3) + dVar3) - dVar3) *
                   pIVar13->My[iVar5] + (double)pIVar13->PixelRange[iVar5].Min.y);
  pGVar8 = this->Getter2;
  pTVar9 = this->Transformer;
  dVar2 = pGVar8->XRef;
  iVar5 = pGVar8->Count;
  dVar20 = log10((double)*(uint *)((long)pGVar8->Ys +
                                  (long)(((prim + pGVar8->Offset) % iVar5 + iVar5) % iVar5) *
                                  (long)pGVar8->Stride) /
                 GImPlot->CurrentPlot->YAxis[pTVar9->YAxis].Range.Min);
  iVar5 = pTVar9->YAxis;
  pIVar10 = pIVar14->CurrentPlot;
  dVar3 = pIVar10->YAxis[iVar5].Range.Min;
  fVar22 = (float)((dVar2 - (pIVar10->XAxis).Range.Min) * pIVar14->Mx +
                  (double)pIVar14->PixelRange[iVar5].Min.x);
  fVar23 = (float)((((double)(float)(dVar20 / pIVar14->LogDenY[iVar5]) *
                     (pIVar10->YAxis[iVar5].Range.Max - dVar3) + dVar3) - dVar3) *
                   pIVar14->My[iVar5] + (double)pIVar14->PixelRange[iVar5].Min.y);
  fVar18 = fVar17;
  if (fVar23 <= fVar17) {
    fVar18 = fVar23;
  }
  bVar16 = false;
  if ((fVar18 < (cull_rect->Max).y) &&
     (fVar18 = (float)(~-(uint)(fVar23 <= fVar17) & (uint)fVar23 |
                      -(uint)(fVar23 <= fVar17) & (uint)fVar17), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar18 && fVar18 != *pfVar1)) {
    fVar18 = fVar21;
    if (fVar22 <= fVar21) {
      fVar18 = fVar22;
    }
    bVar16 = false;
    if (fVar18 < (cull_rect->Max).x) {
      fVar18 = (float)(~-(uint)(fVar22 <= fVar21) & (uint)fVar22 |
                      -(uint)(fVar22 <= fVar21) & (uint)fVar21);
      bVar16 = (cull_rect->Min).x <= fVar18 && fVar18 != (cull_rect->Min).x;
    }
  }
  if (bVar16 != false) {
    fVar18 = this->Weight;
    IVar6 = this->Col;
    IVar4 = *uv;
    fVar24 = fVar22 - fVar21;
    fVar25 = fVar23 - fVar17;
    fVar19 = fVar24 * fVar24 + fVar25 * fVar25;
    if (0.0 < fVar19) {
      if (fVar19 < 0.0) {
        fVar19 = sqrtf(fVar19);
      }
      else {
        fVar19 = SQRT(fVar19);
      }
      fVar24 = fVar24 * (1.0 / fVar19);
      fVar25 = fVar25 * (1.0 / fVar19);
    }
    fVar18 = fVar18 * 0.5;
    fVar24 = fVar24 * fVar18;
    fVar18 = fVar18 * fVar25;
    pIVar11 = DrawList->_VtxWritePtr;
    (pIVar11->pos).x = fVar18 + fVar21;
    (pIVar11->pos).y = fVar17 - fVar24;
    pIVar11->uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar6;
    pIVar11[1].pos.x = fVar18 + fVar22;
    pIVar11[1].pos.y = fVar23 - fVar24;
    pIVar11[1].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar6;
    pIVar11[2].pos.x = fVar22 - fVar18;
    pIVar11[2].pos.y = fVar24 + fVar23;
    pIVar11[2].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar6;
    pIVar11[3].pos.x = fVar21 - fVar18;
    pIVar11[3].pos.y = fVar24 + fVar17;
    pIVar11[3].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    pIVar12 = DrawList->_IdxWritePtr;
    IVar15 = (ImDrawIdx)uVar7;
    *pIVar12 = IVar15;
    pIVar12[1] = IVar15 + 1;
    pIVar12[2] = IVar15 + 2;
    pIVar12[3] = IVar15;
    pIVar12[4] = IVar15 + 2;
    pIVar12[5] = IVar15 + 3;
    DrawList->_IdxWritePtr = pIVar12 + 6;
    DrawList->_VtxCurrentIdx = uVar7 + 4;
  }
  return bVar16;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }